

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O0

void __thiscall
TasGrid::GridWavelet::addChild(GridWavelet *this,int *point,int direction,Data2D<int> *destination)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  value_type local_5c;
  value_type local_58;
  int R;
  int L;
  allocator<int> local_41;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> kid;
  Data2D<int> *destination_local;
  int direction_local;
  int *point_local;
  GridWavelet *this_local;
  
  iVar1 = (this->super_BaseCanonicalGrid).num_dimensions;
  kid.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)destination;
  ::std::allocator<int>::allocator(&local_41);
  ::std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)local_40,point,point + iVar1,&local_41);
  ::std::allocator<int>::~allocator(&local_41);
  RuleWavelet::getChildren(&this->rule1D,point[direction],&local_58,&local_5c);
  pvVar3 = ::std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,(long)direction);
  *pvVar3 = local_58;
  pvVar3 = ::std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,(long)direction);
  if ((*pvVar3 != -1) &&
     (bVar2 = MultiIndexSet::missing
                        (&(this->super_BaseCanonicalGrid).points,
                         (vector<int,_std::allocator<int>_> *)local_40), bVar2)) {
    Data2D<int>::appendStrip
              ((Data2D<int> *)
               kid.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage,(vector<int,_std::allocator<int>_> *)local_40);
  }
  pvVar3 = ::std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,(long)direction);
  *pvVar3 = local_5c;
  pvVar3 = ::std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,(long)direction);
  if ((*pvVar3 != -1) &&
     (bVar2 = MultiIndexSet::missing
                        (&(this->super_BaseCanonicalGrid).points,
                         (vector<int,_std::allocator<int>_> *)local_40), bVar2)) {
    Data2D<int>::appendStrip
              ((Data2D<int> *)
               kid.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage,(vector<int,_std::allocator<int>_> *)local_40);
  }
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  return;
}

Assistant:

void GridWavelet::addChild(const int point[], int direction, Data2D<int> &destination) const{
    std::vector<int> kid(point, point + num_dimensions);
    int L, R; rule1D.getChildren(point[direction], L, R);
    kid[direction] = L;
    if ((kid[direction] != -1) && points.missing(kid)){
        destination.appendStrip(kid);
    }
    kid[direction] = R;
    if ((kid[direction] != -1) && points.missing(kid)){
        destination.appendStrip(kid);
}
}